

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebur128.c
# Opt level: O3

int ebur128_loudness_shortterm(ebur128_state *st,double *out)

{
  ulong frames_per_block;
  int iVar1;
  double in_RAX;
  double dVar2;
  double energy;
  double local_18;
  
  frames_per_block = st->d->samples_in_100ms * 0x1e;
  iVar1 = 2;
  if (frames_per_block <= st->d->audio_data_frames) {
    local_18 = in_RAX;
    ebur128_calc_gating_block(st,frames_per_block,&local_18);
    if (local_18 <= 0.0) {
      dVar2 = -INFINITY;
    }
    else {
      dVar2 = log(local_18);
      dVar2 = (dVar2 / 2.302585092994046) * 10.0 + -0.691;
    }
    *out = dVar2;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int ebur128_loudness_shortterm(ebur128_state* st, double* out) {
  double energy;
  int error;

  error = ebur128_energy_shortterm(st, &energy);
  if (error) {
    return error;
  }

  if (energy <= 0.0) {
    *out = -HUGE_VAL;
    return EBUR128_SUCCESS;
  }

  *out = ebur128_energy_to_loudness(energy);
  return EBUR128_SUCCESS;
}